

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_OneShot_Test::~TEST_WiningStateTest_OneShot_Test
          (TEST_WiningStateTest_OneShot_Test *this)

{
  TEST_WiningStateTest_OneShot_Test *mem;
  TEST_WiningStateTest_OneShot_Test *this_local;
  
  mem = this;
  ~TEST_WiningStateTest_OneShot_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(WiningStateTest, OneShot)
{
	addNoWiningHand();
	h.readyHand();

	WinByDiscardSituation situation;
	situation.is_one_shot = true;

	winByDiscard(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ReadyHand));
	CHECK_EQUAL(1, r.patterns.count(Pattern::OneShot));
	CHECK_EQUAL(2, r.doubling_factor);
}